

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::cpp::CppGenerator::UnionVerifySignature_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,EnumDef *enum_def)

{
  string local_d0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  EnumDef *local_20;
  EnumDef *enum_def_local;
  CppGenerator *this_local;
  
  local_20 = enum_def;
  enum_def_local = (EnumDef *)this;
  this_local = (CppGenerator *)__return_storage_ptr__;
  Name_abi_cxx11_(&local_a0,this,&enum_def->super_Definition);
  std::operator+(&local_80,"bool Verify",&local_a0);
  std::operator+(&local_60,&local_80,"(::flatbuffers::Verifier &verifier, const void *obj, ");
  Name_abi_cxx11_(&local_d0,this,&local_20->super_Definition);
  std::operator+(&local_40,&local_60,&local_d0);
  std::operator+(__return_storage_ptr__,&local_40," type)");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  return __return_storage_ptr__;
}

Assistant:

std::string UnionVerifySignature(const EnumDef &enum_def) {
    return "bool Verify" + Name(enum_def) +
           "(::flatbuffers::Verifier &verifier, const void *obj, " +
           Name(enum_def) + " type)";
  }